

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 GenStateEmitExprCode(jx9_gen_state *pGen,jx9_expr_node *pNode,sxi32 iFlags)

{
  ProcNodeConstruct p_Var1;
  jx9_expr_op *pjVar2;
  SySet *pSVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  sxi32 sVar7;
  VmInstr *pVVar8;
  sxu32 sVar9;
  long lVar10;
  void *pvVar11;
  jx9_expr_node *pNode_00;
  jx9_vm *pjVar12;
  sxu32 sVar13;
  sxu32 sVar14;
  int iOp;
  sxu32 nJmpIdx;
  sxu32 nJmp;
  SyToken *local_48;
  SyToken *pSStack_40;
  sxu32 nJz;
  
  p_Var1 = pNode->xCode;
  if (p_Var1 != (ProcNodeConstruct)0x0) {
    local_48 = pGen->pIn;
    pSStack_40 = pGen->pEnd;
    uVar4 = *(undefined4 *)((long)&pNode->pStart + 4);
    uVar5 = *(undefined4 *)&pNode->pEnd;
    uVar6 = *(undefined4 *)((long)&pNode->pEnd + 4);
    *(undefined4 *)&pGen->pIn = *(undefined4 *)&pNode->pStart;
    *(undefined4 *)((long)&pGen->pIn + 4) = uVar4;
    *(undefined4 *)&pGen->pEnd = uVar5;
    *(undefined4 *)((long)&pGen->pEnd + 4) = uVar6;
    sVar7 = (*p_Var1)(pGen,iFlags);
    pGen->pIn = local_48;
    pGen->pEnd = pSStack_40;
    return sVar7;
  }
  pjVar2 = pNode->pOp;
  if (pjVar2 == (jx9_expr_op *)0x0) {
    jx9GenCompileError(pGen,1,pNode->pStart->nLine,
                       "Invalid expression node, JX9 is aborting compilation");
    return -10;
  }
  if (pjVar2->iOp == 0x26) {
    sVar7 = GenStateEmitExprCode(pGen,pNode->pCond,iFlags);
    if (sVar7 != 0) {
      return sVar7;
    }
    nJmp = 0;
    nJz = 0;
    jx9VmEmitInstr(pGen->pVm,9,0,0,(void *)0x0,&nJz);
    if ((pNode->pLeft != (jx9_expr_node *)0x0) &&
       (sVar7 = GenStateEmitExprCode(pGen,pNode->pLeft,iFlags), sVar7 != 0)) {
      return sVar7;
    }
    jx9VmEmitInstr(pGen->pVm,8,0,0,(void *)0x0,&nJmp);
    pSVar3 = pGen->pVm->pByteContainer;
    if ((nJz < pSVar3->nUsed) && (pSVar3->pBase != (void *)0x0)) {
      *(sxu32 *)((long)pSVar3->pBase + (ulong)(nJz * pSVar3->eSize) + 8) = pSVar3->nUsed;
    }
    if ((pNode->pRight != (jx9_expr_node *)0x0) &&
       (sVar7 = GenStateEmitExprCode(pGen,pNode->pRight,iFlags), sVar7 != 0)) {
      return sVar7;
    }
    if (nJmp == 0) {
      return 0;
    }
    pSVar3 = pGen->pVm->pByteContainer;
    if (pSVar3->nUsed <= nJmp) {
      return 0;
    }
    if (pSVar3->pBase == (void *)0x0) {
      return 0;
    }
    *(sxu32 *)((long)pSVar3->pBase + (ulong)(nJmp * pSVar3->eSize) + 8) = pSVar3->nUsed;
    return 0;
  }
  iOp = pjVar2->iVmOp;
  pNode_00 = pNode->pLeft;
  if (pNode_00 == (jx9_expr_node *)0x0) {
    sVar9 = 0;
    sVar13 = 0;
  }
  else {
    sVar13 = 0;
    if (iOp == 0x10) {
      local_48 = (SyToken *)CONCAT44(local_48._4_4_,iFlags);
      pvVar11 = (pNode->aNodeArgs).pBase;
      lVar10 = 0;
      while (sVar13 = (pNode->aNodeArgs).nUsed, lVar10 < (int)sVar13) {
        sVar7 = GenStateEmitExprCode(pGen,*(jx9_expr_node **)((long)pvVar11 + lVar10 * 8),2);
        lVar10 = lVar10 + 1;
        if (sVar7 != 0) {
          return sVar7;
        }
      }
      iFlags = (uint)local_48 & 0xfffffffd;
      pNode_00 = pNode->pLeft;
    }
    sVar7 = GenStateEmitExprCode(pGen,pNode_00,iFlags);
    if (sVar7 != 0) {
      return sVar7;
    }
    if (iOp == 0x10) {
      pVVar8 = jx9VmPeekInstr(pGen->pVm);
      sVar9 = 0;
      if (pVVar8 != (VmInstr *)0x0) {
        if (pVVar8->iOp == '?') {
          pVVar8->iP2 = 1;
          sVar9 = 0;
        }
        else if (pVVar8->iOp == '\x04') {
          pVVar8->iP1 = 0;
        }
      }
    }
    else if (iOp == 5) {
      local_48 = (SyToken *)(pNode->aNodeArgs).pBase;
      lVar10 = 0;
      while (sVar9 = (pNode->aNodeArgs).nUsed, lVar10 < (int)sVar9) {
        sVar7 = GenStateEmitExprCode
                          (pGen,*(jx9_expr_node **)((long)local_48 + lVar10 * 8),iFlags & 0xfffffffe
                          );
        lVar10 = lVar10 + 1;
        if (sVar7 != 0) {
          return sVar7;
        }
      }
      if (sVar9 != 0) {
        sVar13 = 1;
      }
      sVar9 = iFlags & 1;
    }
    else {
      sVar9 = 0;
      if (pNode->pOp->iOp == 0x33) {
        jx9VmEmitInstr(pGen->pVm,0xb,1,0,(void *)0x0,(sxu32 *)0x0);
        sVar9 = 0;
      }
    }
  }
  sVar7 = 0;
  nJmpIdx = 0;
  if (pNode->pRight == (jx9_expr_node *)0x0) {
LAB_00125381:
    if (iOp < 1) {
      return sVar7;
    }
    local_48 = (SyToken *)CONCAT44(local_48._4_4_,sVar7);
    pvVar11 = (void *)0x0;
  }
  else {
    if (iOp == 0x28) {
      pjVar12 = pGen->pVm;
      sVar7 = 10;
LAB_00125302:
      jx9VmEmitInstr(pjVar12,sVar7,1,0,(void *)0x0,&nJmpIdx);
    }
    else {
      if (iOp == 0x27) {
        pjVar12 = pGen->pVm;
        sVar7 = 9;
        goto LAB_00125302;
      }
      iFlags = iFlags | (uint)(pNode->pOp->iPrec == 0x12);
    }
    sVar7 = GenStateEmitExprCode(pGen,pNode->pRight,iFlags);
    if (iOp != 0x2a) goto LAB_00125381;
    pjVar12 = pGen->pVm;
    pVVar8 = jx9VmPeekInstr(pjVar12);
    iOp = 0x2a;
    local_48 = (SyToken *)CONCAT44(local_48._4_4_,sVar7);
    sVar14 = sVar13;
    if (pVVar8 == (VmInstr *)0x0) {
      pvVar11 = (void *)0x0;
      goto LAB_0012544b;
    }
    if (pVVar8->iOp == '?') {
      pvVar11 = (void *)0x0;
      sVar9 = 1;
      goto LAB_0012544b;
    }
    if (pVVar8->iOp == '\x05') {
      sVar13 = pVVar8->iP1;
      iOp = 0x2b;
      pvVar11 = (void *)0x0;
    }
    else {
      pvVar11 = pVVar8->p3;
      iOp = 0x2a;
    }
    jx9VmPopInstr(pjVar12);
  }
  sVar14 = sVar13;
  if ((iOp - 0x31U < 2) && (sVar14 = 1, (pNode->iFlags & 1) == 0)) {
    sVar14 = sVar13;
  }
LAB_0012544b:
  jx9VmEmitInstr(pGen->pVm,iOp,sVar14,sVar9,pvVar11,(sxu32 *)0x0);
  if (nJmpIdx != 0) {
    pSVar3 = pGen->pVm->pByteContainer;
    if ((nJmpIdx < pSVar3->nUsed) && (pSVar3->pBase != (void *)0x0)) {
      *(sxu32 *)((long)pSVar3->pBase + (ulong)(nJmpIdx * pSVar3->eSize) + 8) = pSVar3->nUsed;
    }
  }
  return (uint)local_48;
}

Assistant:

static sxi32 GenStateEmitExprCode(
	jx9_gen_state *pGen,  /* Code generator state */
	jx9_expr_node *pNode, /* Root of the expression tree */
	sxi32 iFlags /* Control flags */
	)
{
	VmInstr *pInstr;
	sxu32 nJmpIdx;
	sxi32 iP1 = 0;
	sxu32 iP2 = 0;
	void *p3  = 0;
	sxi32 iVmOp;
	sxi32 rc;
	if( pNode->xCode ){
		SyToken *pTmpIn, *pTmpEnd;
		/* Compile node */
		SWAP_DELIMITER(pGen, pNode->pStart, pNode->pEnd);
		rc = pNode->xCode(&(*pGen), iFlags);
		RE_SWAP_DELIMITER(pGen);
		return rc;
	}
	if( pNode->pOp == 0 ){
		jx9GenCompileError(&(*pGen), E_ERROR, pNode->pStart->nLine, 
			"Invalid expression node, JX9 is aborting compilation");
		return SXERR_ABORT;
	}
	iVmOp = pNode->pOp->iVmOp;
	if( pNode->pOp->iOp == EXPR_OP_QUESTY ){
		sxu32 nJz, nJmp;
		/* Ternary operator require special handling */
		/* Phase#1: Compile the condition */
		rc = GenStateEmitExprCode(&(*pGen), pNode->pCond, iFlags);
		if( rc != SXRET_OK ){
			return rc;
		}
		nJz = nJmp = 0; /* cc -O6 warning */
		/* Phase#2: Emit the false jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 0, 0, 0, &nJz);
		if( pNode->pLeft ){
			/* Phase#3: Compile the 'then' expression  */
			rc = GenStateEmitExprCode(&(*pGen), pNode->pLeft, iFlags);
			if( rc != SXRET_OK ){
				return rc;
			}
		}
		/* Phase#4: Emit the unconditional jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, 0, 0, &nJmp);
		/* Phase#5: Fix the false jump now the jump destination is resolved. */
		pInstr = jx9VmGetInstr(pGen->pVm, nJz);
		if( pInstr ){
			pInstr->iP2 = jx9VmInstrLength(pGen->pVm);
		}
		/* Phase#6: Compile the 'else' expression */
		if( pNode->pRight ){
			rc = GenStateEmitExprCode(&(*pGen), pNode->pRight, iFlags);
			if( rc != SXRET_OK ){
				return rc;
			}
		}
		if( nJmp > 0 ){
			/* Phase#7: Fix the unconditional jump */
			pInstr = jx9VmGetInstr(pGen->pVm, nJmp);
			if( pInstr ){
				pInstr->iP2 = jx9VmInstrLength(pGen->pVm);
			}
		}
		/* All done */
		return SXRET_OK;
	}
	/* Generate code for the left tree */
	if( pNode->pLeft ){
		if( iVmOp == JX9_OP_CALL ){
			jx9_expr_node **apNode;
			sxi32 n;
			/* Recurse and generate bytecodes for function arguments */
			apNode = (jx9_expr_node **)SySetBasePtr(&pNode->aNodeArgs);
			/* Read-only load */
			iFlags |= EXPR_FLAG_RDONLY_LOAD;
			for( n = 0 ; n < (sxi32)SySetUsed(&pNode->aNodeArgs) ; ++n ){
				rc = GenStateEmitExprCode(&(*pGen), apNode[n], iFlags&~EXPR_FLAG_LOAD_IDX_STORE);
				if( rc != SXRET_OK ){
					return rc;
				}
			}
			/* Total number of given arguments */
			iP1 = (sxi32)SySetUsed(&pNode->aNodeArgs);
			/* Remove stale flags now */
			iFlags &= ~EXPR_FLAG_RDONLY_LOAD;
		}
		rc = GenStateEmitExprCode(&(*pGen), pNode->pLeft, iFlags);
		if( rc != SXRET_OK ){
			return rc;
		}
		if( iVmOp == JX9_OP_CALL ){
			pInstr = jx9VmPeekInstr(pGen->pVm);
			if( pInstr ){
				if ( pInstr->iOp == JX9_OP_LOADC ){
					/* Prevent constant expansion */
					pInstr->iP1 = 0;
				}else if( pInstr->iOp == JX9_OP_MEMBER /* $a.b(1, 2, 3) */  ){
					/* Annonymous function call, flag that */
					pInstr->iP2 = 1;
				}
			}
		}else if( iVmOp == JX9_OP_LOAD_IDX ){
			jx9_expr_node **apNode;
			sxi32 n;
			/* Recurse and generate bytecodes for array index */
			apNode = (jx9_expr_node **)SySetBasePtr(&pNode->aNodeArgs);
			for( n = 0 ; n < (sxi32)SySetUsed(&pNode->aNodeArgs) ; ++n ){
				rc = GenStateEmitExprCode(&(*pGen), apNode[n], iFlags&~EXPR_FLAG_LOAD_IDX_STORE);
				if( rc != SXRET_OK ){
					return rc;
				}
			}
			if( SySetUsed(&pNode->aNodeArgs) > 0 ){
				iP1 = 1; /* Node have an index associated with it */
			}
			if( iFlags & EXPR_FLAG_LOAD_IDX_STORE ){
				/* Create an empty entry when the desired index is not found */
				iP2 = 1;
			}
		}else if( pNode->pOp->iOp == EXPR_OP_COMMA ){
			/* POP the left node */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
		}
	}
	rc = SXRET_OK;
	nJmpIdx = 0;
	/* Generate code for the right tree */
	if( pNode->pRight ){
		if( iVmOp == JX9_OP_LAND ){
			/* Emit the false jump so we can short-circuit the logical and */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 1/* Keep the value on the stack */, 0, 0, &nJmpIdx);
		}else if (iVmOp == JX9_OP_LOR ){
			/* Emit the true jump so we can short-circuit the logical or*/
			jx9VmEmitInstr(pGen->pVm, JX9_OP_JNZ, 1/* Keep the value on the stack */, 0, 0, &nJmpIdx);
		}else if( pNode->pOp->iPrec == 18 /* Combined binary operators [i.e: =, '.=', '+=', *=' ...] precedence */ ){
			iFlags |= EXPR_FLAG_LOAD_IDX_STORE;
		}
		rc = GenStateEmitExprCode(&(*pGen), pNode->pRight, iFlags);
		if( iVmOp == JX9_OP_STORE ){
			pInstr = jx9VmPeekInstr(pGen->pVm);
			if( pInstr ){
				if(pInstr->iOp == JX9_OP_MEMBER ){
					/* Perform a member store operation [i.e: $this.x = 50] */
					iP2 = 1;
				}else{
					if( pInstr->iOp == JX9_OP_LOAD_IDX ){
						/* Transform the STORE instruction to STORE_IDX instruction */
						iVmOp = JX9_OP_STORE_IDX;
						iP1 = pInstr->iP1;
					}else{
						p3 = pInstr->p3;
					}
					/* POP the last dynamic load instruction */
					(void)jx9VmPopInstr(pGen->pVm);
				}
			}
		}
	}
	if( iVmOp > 0 ){
		if( iVmOp == JX9_OP_INCR || iVmOp == JX9_OP_DECR ){
			if( pNode->iFlags & EXPR_NODE_PRE_INCR ){
				/* Pre-increment/decrement operator [i.e: ++$i, --$j ] */
				iP1 = 1;
			}
		}
		/* Finally, emit the VM instruction associated with this operator */
		jx9VmEmitInstr(pGen->pVm, iVmOp, iP1, iP2, p3, 0);
		if( nJmpIdx > 0 ){
			/* Fix short-circuited jumps now the destination is resolved */
			pInstr = jx9VmGetInstr(pGen->pVm, nJmpIdx);
			if( pInstr ){
				pInstr->iP2 = jx9VmInstrLength(pGen->pVm);
			}
		}
	}
	return rc;
}